

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O1

void transform_rtvad_aux(List *root,List *code,char (*decls) [5] [1024])

{
  byte bVar1;
  byte bVar2;
  BOOL BVar3;
  char *var_name;
  size_t sVar4;
  char *__s;
  Token copy_of_t;
  char buf [128];
  Token local_d8;
  char local_b8 [136];
  
  if (code != (List *)0x0) {
    if ((code->token).type == TOK_TEMP_REGISTER) {
      BVar3 = temp_use_consistent(root,&code->token);
      if (BVar3 != FALSE) {
        bVar1 = (code->token).u.reginfo.sgnd;
        bVar2 = (code->token).u.reginfo.size;
        __s = (*decls)[bVar2] + (uint)bVar1 * 0x1400;
        local_d8.type = (code->token).type;
        local_d8._4_4_ = *(undefined4 *)&(code->token).field_0x4;
        local_d8.u.n._0_4_ = *(undefined4 *)&(code->token).u;
        local_d8.u.n._4_4_ = *(undefined4 *)((long)&(code->token).u + 4);
        local_d8.filename._0_4_ = *(undefined4 *)&(code->token).filename;
        local_d8.filename._4_4_ = *(undefined4 *)((long)&(code->token).filename + 4);
        local_d8.lineno._0_4_ = (undefined4)(code->token).lineno;
        local_d8.lineno._4_4_ = *(undefined4 *)((long)&(code->token).lineno + 4);
        sprintf(local_b8,"tmp%c%c%d",(ulong)((uint)(bVar1 == 0) * 2 + 0x73),
                (ulong)(uint)(int)"?bw?l"[bVar2],(ulong)(code->token).u.reginfo.which);
        var_name = unique_string(local_b8);
        if ((*decls)[bVar2][(uint)bVar1 * 0x1400] != '\0') {
          sVar4 = strlen(__s);
          (__s + sVar4)[0] = ',';
          (__s + sVar4)[1] = '\0';
        }
        sVar4 = strlen(__s);
        sprintf(__s + sVar4," %s",var_name);
        transform_reg_to_var(root,&local_d8,var_name);
      }
    }
    transform_rtvad_aux(root,code->car,decls);
    transform_rtvad_aux(root,code->cdr,decls);
  }
  return;
}

Assistant:

static void
transform_rtvad_aux (List *root, List *code, char decls[2][5][1024])
{
  Token *t;

  /* Recursion base case. */
  if (code == NULL)
    return;

  t = &code->token;
  if (t->type == TOK_TEMP_REGISTER && temp_use_consistent (root, t))
    {
      char buf[128], *s = decls[t->u.reginfo.sgnd][t->u.reginfo.size];
      const char *name;
      Token copy_of_t = *t;

      /* Choose a descriptive + unique name for this new temp variable. */
      sprintf (buf, "tmp%c%c%d", t->u.reginfo.sgnd ? 's' : 'u',
	       "?bw?l"[t->u.reginfo.size], t->u.reginfo.which);
      name = unique_string (buf);

      /* Add this variable's name to the list of variables of this type
       * to declare.
       */
      if (s[0] != '\0')  /* Add a comma if there are previous decls. */
	strcat (s, ",");
      sprintf (s + strlen (s), " %s", name);

      /* Replace all occurrences of this temp register with the temp
       * variable we just made.
       */
      transform_reg_to_var (root, &copy_of_t, name);
    }

  /* Recurse on the rest of the code. */
  transform_rtvad_aux (root, code->car, decls);
  transform_rtvad_aux (root, code->cdr, decls);
}